

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnFuncType
          (SharedValidator *this,Location *loc,Index param_count,Type *param_types,
          Index result_count,Type *result_types,Index type_index)

{
  bool bVar1;
  TypeVector local_b0;
  TypeVector local_98;
  FuncType local_80;
  Index local_48;
  Enum local_44;
  Type *local_40;
  Type *result_types_local;
  Type *pTStack_30;
  Index result_count_local;
  Type *param_types_local;
  Location *pLStack_20;
  Index param_count_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_40 = result_types;
  result_types_local._4_4_ = result_count;
  pTStack_30 = param_types;
  param_types_local._4_4_ = param_count;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  bVar1 = Features::multi_value_enabled((Features *)this);
  if ((!bVar1) && (1 < result_types_local._4_4_)) {
    local_44 = (Enum)PrintError(this,pLStack_20,
                                "multiple result values are not supported without multi-value enabled."
                               );
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
  }
  local_48 = this->num_types_;
  this->num_types_ = local_48 + 1;
  ToTypeVector(&local_98,this,param_types_local._4_4_,pTStack_30);
  ToTypeVector(&local_b0,this,result_types_local._4_4_,local_40);
  FuncType::FuncType(&local_80,&local_98,&local_b0,type_index);
  std::
  map<unsigned_int,wabt::SharedValidator::FuncType,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>>
  ::emplace<unsigned_int,wabt::SharedValidator::FuncType>
            ((map<unsigned_int,wabt::SharedValidator::FuncType,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>>
              *)&this->func_types_,&local_48,&local_80);
  FuncType::~FuncType(&local_80);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_b0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_98);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnFuncType(const Location& loc,
                                   Index param_count,
                                   const Type* param_types,
                                   Index result_count,
                                   const Type* result_types,
                                   Index type_index) {
  Result result = Result::Ok;
  if (!options_.features.multi_value_enabled() && result_count > 1) {
    result |= PrintError(loc,
                         "multiple result values are not supported without "
                         "multi-value enabled.");
  }
  func_types_.emplace(
      num_types_++,
      FuncType{ToTypeVector(param_count, param_types),
               ToTypeVector(result_count, result_types), type_index});
  return result;
}